

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void augment_colors(char *colors,int **attr,int *nattr)

{
  int iVar1;
  size_t sVar2;
  int *__dest;
  int *newattr;
  wchar_t n;
  int *nattr_local;
  int **attr_local;
  char *colors_local;
  
  sVar2 = strlen(colors);
  iVar1 = (int)sVar2;
  if (*nattr < iVar1) {
    __dest = (int *)mem_alloc((long)iVar1 << 2);
    if (0 < *nattr) {
      memcpy(__dest,*attr,(long)*nattr << 2);
    }
    mem_free(*attr);
    convert_chars_to_attrs(colors + *nattr,iVar1 - *nattr,__dest + *nattr);
    *attr = __dest;
    *nattr = iVar1;
  }
  return;
}

Assistant:

static void augment_colors(const char *colors, int **attr, int *nattr)
{
	int n = (int) strlen(colors);

	if (*nattr < n) {
		int *newattr = mem_alloc(sizeof(*newattr) * n);

		if (*nattr > 0) {
			(void) memcpy(newattr, *attr, *nattr *
				sizeof(*newattr));
		}
		mem_free(*attr);
		convert_chars_to_attrs(colors + *nattr, n - *nattr,
			newattr + *nattr);
		*attr = newattr;
		*nattr = n;
	}
}